

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_wallmarks.cxx
# Opt level: O3

void __thiscall write_wm_slot::operator()(write_wm_slot *this,wm_slot *slot,xr_writer *w)

{
  pointer pwVar1;
  undefined4 in_EAX;
  pointer wm;
  undefined4 uStack_28;
  int local_24;
  
  _uStack_28 = CONCAT44((int)((ulong)((long)(slot->wallmarks).
                                            super__Vector_base<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(slot->wallmarks).
                                           super__Vector_base<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x33333333,in_EAX);
  (*w->_vptr_xr_writer[2])(w,&local_24,4);
  xray_re::xr_writer::w_sz(w,&slot->shader);
  xray_re::xr_writer::w_sz(w,&slot->texture);
  wm = (slot->wallmarks).super__Vector_base<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pwVar1 = (slot->wallmarks).super__Vector_base<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (wm != pwVar1) {
    do {
      write_wm_data::operator()((write_wm_data *)((long)&uStack_28 + 3),wm,w);
      wm = wm + 1;
    } while (wm != pwVar1);
  }
  return;
}

Assistant:

void operator()(const wm_slot* slot, xr_writer& w) const {
	w.w_size_u32(slot->wallmarks.size());
	w.w_sz(slot->shader);
	w.w_sz(slot->texture);
	w.w_seq(slot->wallmarks, write_wm_data());
}